

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Array path;
  ulong uVar5;
  Array path_00;
  RGBFilm *this_00;
  uintptr_t iptr;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar6;
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [56];
  float fVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [56];
  undefined1 in_register_000012c4 [12];
  Bounds2f BVar21;
  SampledSpectrum SVar22;
  int local_168;
  int local_164;
  aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)> local_138;
  char local_130;
  Tuple2<pbrt::Point2,_float> local_128;
  undefined8 uStack_120;
  Tuple2<pbrt::Point2,_float> local_118;
  undefined8 uStack_110;
  SamplerHandle local_100;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_f8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_f0;
  uintptr_t local_e8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_e0;
  SamplerHandle local_d8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_d0;
  SamplerHandle local_c8;
  optional<pbrt::CameraRayDifferential> crd;
  CameraSample local_48;
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar19 [64];
  
  uVar17 = in_ZMM1._12_8_;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_164 = 0;
    local_168 = 2;
    fVar16 = 1.0;
  }
  else {
    FVar7 = MLTSampler::Get1D(sampler);
    fVar16 = (float)(depth + 2);
    local_164 = depth + 1;
    if ((int)(FVar7 * fVar16) <= depth + 1) {
      local_164 = (int)(FVar7 * fVar16);
    }
    local_168 = (depth + 2) - local_164;
  }
  if (*(char *)(Options + 0xd) == '\x01') {
    FVar7 = 0.5;
    uVar2 = *(ulong *)(((this->camera).
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff) + 0x340);
    this_00 = (RGBFilm *)(uVar2 & 0xffffffffffff);
    if (uVar2 < 0x2000000000000) goto LAB_004582ab;
LAB_004582db:
    GBufferFilm::SampleWavelengths((SampledWavelengths *)&crd,(GBufferFilm *)this_00,FVar7);
  }
  else {
    uVar2 = *(ulong *)(((this->camera).
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff) + 0x340);
    FVar7 = MLTSampler::Get1D(sampler);
    this_00 = (RGBFilm *)(uVar2 & 0xffffffffffff);
    if (0x1ffffffffffff < uVar2) goto LAB_004582db;
LAB_004582ab:
    RGBFilm::SampleWavelengths((SampledWavelengths *)&crd,this_00,FVar7);
  }
  *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
  *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
  *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
  *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  auVar11._0_8_ = crd.optionalValue._8_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_168);
  BVar21 = FilmBase::SampleBounds
                     ((FilmBase *)
                      (*(ulong *)(((this->camera).
                                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                   .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff));
  local_128 = (Tuple2<pbrt::Point2,_float>)BVar21.pMax.super_Tuple2<pbrt::Point2,_float>;
  local_118 = (Tuple2<pbrt::Point2,_float>)BVar21.pMin.super_Tuple2<pbrt::Point2,_float>;
  uStack_120 = uVar17;
  uStack_110 = auVar11._0_8_;
  auVar12._0_8_ = MLTSampler::Get2D(sampler);
  auVar12._8_56_ = extraout_var;
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar18,auVar12._0_16_);
  auVar9._0_4_ = auVar12._0_4_ * local_128.x;
  auVar9._4_4_ = auVar12._4_4_ * local_128.y;
  auVar9._8_4_ = extraout_var._0_4_ * (float)uStack_120;
  auVar9._12_4_ = extraout_var._4_4_ * uStack_120._4_4_;
  auVar3._8_8_ = uStack_110;
  auVar3._0_4_ = local_118.x;
  auVar3._4_4_ = local_118.y;
  auVar18 = vfmadd231ps_fma(auVar9,auVar18,auVar3);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar18);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  local_48.time = 0.0;
  local_48.weight = 1.0;
  local_48.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_48.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_48.pFilm.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar18);
  FVar7 = MLTSampler::Get1D(sampler);
  local_48.time = FVar7;
  auVar13._0_8_ = MLTSampler::Get2D(sampler);
  auVar13._8_56_ = extraout_var_00;
  local_48.pLens.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar13._0_16_);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,&local_48,lambda);
  uVar17 = 0;
  if (crd.set == true) {
    if (((float)crd.optionalValue._96_4_ == 0.0) && (!NAN((float)crd.optionalValue._96_4_))) {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 3) goto LAB_0045840d;
        fVar8 = *(float *)((long)&crd.optionalValue + uVar5 * 4 + 100);
      } while ((fVar8 == 0.0) && (uVar2 = uVar5 + 1, !NAN(fVar8)));
      if (2 < uVar5) goto LAB_0045840d;
    }
    auVar10._0_4_ = (float)sampler->mutationsPerPixel;
    auVar10._4_12_ = in_register_000012c4;
    if (auVar10._0_4_ < 0.0) {
      fVar8 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar18 = vsqrtss_avx(auVar10,auVar10);
      fVar8 = auVar18._0_4_;
    }
    if (crd.set == true) {
      auVar18 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar8)),ZEXT416(0x3e000000));
      RayDifferential::ScaleDifferentials((RayDifferential *)&crd,auVar18._0_4_);
      if (crd.set != false) {
        TVar6.bits = (ulong)sampler | 0x7000000000000;
        local_d0.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_c8.
        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar6.bits;
        iVar4 = GenerateCameraSubpath
                          (&this->super_Integrator,(RayDifferential *)&crd,lambda,&local_c8,
                           scratchBuffer,local_168,(CameraHandle *)&local_d0,path,this->regularize);
        if (iVar4 == local_168) {
          MLTSampler::StartStream(sampler,1);
          path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_164);
          local_e0.bits =
               (this->camera).
               super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               .bits;
          local_e8 = (this->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
          local_d8.
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )TVar6.bits;
          iVar4 = GenerateLightSubpath
                            (&this->super_Integrator,lambda,&local_d8,(CameraHandle *)&local_e0,
                             scratchBuffer,local_164,(path->field_2).ei.super_Interaction.time,
                             (LightSamplerHandle)&local_e8,path_00,this->regularize);
          auVar11._0_8_ = 0;
          auVar15 = ZEXT856(0);
          uVar17 = 0;
          auVar20 = ZEXT856(0);
          if (iVar4 == local_164) {
            MLTSampler::StartStream(sampler,2);
            local_130 = '\0';
            local_f0.bits =
                 (this->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
            local_f8.bits =
                 (this->camera).
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 .bits;
            local_100.
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       )TVar6.bits;
            SVar22 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,local_164,local_168,
                                 (LightSamplerHandle *)&local_f0,(CameraHandle *)&local_f8,
                                 &local_100,(optional<pbrt::Point2<float>_> *)&local_138.__align,
                                 (Float *)0x0);
            auVar19._0_8_ = SVar22.values.values._8_8_;
            auVar19._8_56_ = auVar20;
            auVar14._0_8_ = SVar22.values.values._0_8_;
            auVar14._8_56_ = auVar15;
            auVar18 = vmovlhps_avx(auVar14._0_16_,auVar19._0_16_);
            auVar11._0_8_ = CONCAT44(fVar16 * auVar18._4_4_,fVar16 * auVar18._0_4_);
            auVar11._8_4_ = fVar16 * auVar18._8_4_;
            auVar11._12_4_ = fVar16 * auVar18._12_4_;
            if (local_130 == '\x01') {
              pRaster->super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_138;
            }
            auVar18 = vshufpd_avx(auVar11,auVar11,1);
            uVar17 = auVar18._0_8_;
          }
        }
        else {
          auVar11._0_8_ = 0;
          uVar17 = 0;
        }
        goto LAB_004585d5;
      }
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
  }
LAB_0045840d:
  auVar11._0_8_ = 0;
LAB_004585d5:
  SVar22.values.values[2] = (float)(int)uVar17;
  SVar22.values.values[3] = (float)(int)((ulong)uVar17 >> 0x20);
  SVar22.values.values[0] = (float)(int)auVar11._0_8_;
  SVar22.values.values[1] = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew.has_value())
        *pRaster = *pRasterNew;
    return L;
}